

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void get_ui_entry_label(ui_entry *entry,wchar_t length,_Bool pad_left,wchar_t *label)

{
  size_t sVar1;
  wchar_t local_3c;
  wchar_t i;
  size_t nw;
  wchar_t *pwStack_28;
  wchar_t n;
  wchar_t *src;
  wchar_t *label_local;
  _Bool pad_left_local;
  wchar_t length_local;
  ui_entry *entry_local;
  
  if (get_ui_entry_label::first_call) {
    sVar1 = text_mbstowcs(get_ui_entry_label::spc," ",L'\x02');
    if (sVar1 == 0xffffffffffffffff) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x132,"void get_ui_entry_label(const struct ui_entry *, int, _Bool, wchar_t *)"
                   );
    }
    get_ui_entry_label::first_call = false;
  }
  if (L'\0' < length) {
    if (length == L'\x01') {
      *label = get_ui_entry_label::spc[1];
    }
    else {
      if (length < L'\f') {
        pwStack_28 = entry->shortened_labels[length + L'\xfffffffe'];
        nw._4_4_ = entry->nshortened[length + L'\xfffffffe'];
      }
      else {
        pwStack_28 = entry->label;
        nw._4_4_ = entry->nlabel;
      }
      if (nw._4_4_ < length + L'\xffffffff') {
        if (pad_left) {
          for (local_3c = 0; local_3c < (length + L'\xffffffff') - nw._4_4_; local_3c = local_3c + 1
              ) {
            label[local_3c] = get_ui_entry_label::spc[0];
          }
          memcpy(label + (long)length + (-1 - (long)nw._4_4_),pwStack_28,(long)nw._4_4_ << 2);
        }
        else {
          memcpy(label,pwStack_28,(long)nw._4_4_ << 2);
          for (local_3c = nw._4_4_; local_3c < length + L'\xffffffff'; local_3c = local_3c + L'\x01'
              ) {
            label[local_3c] = get_ui_entry_label::spc[0];
          }
        }
      }
      else {
        memcpy(label,pwStack_28,(long)(length + L'\xffffffff') << 2);
      }
      label[length + L'\xffffffff'] = get_ui_entry_label::spc[1];
    }
  }
  return;
}

Assistant:

void get_ui_entry_label(const struct ui_entry *entry, int length,
	bool pad_left, wchar_t *label)
{
	static bool first_call = true;
	static wchar_t spc[2];
	const wchar_t *src;
	int n;

	if (first_call) {
		size_t nw = text_mbstowcs(spc, " ", 2);

		if (nw == (size_t)-1) assert(0);
		first_call = false;
	}

	if (length <= 0) {
		return;
	}
	if (length == 1) {
		label[0] = spc[1];
		return;
	}
	if (length <= MAX_SHORTENED + 1) {
		src = entry->shortened_labels[length - 2];
		n = entry->nshortened[length - 2];
	} else {
		src = entry->label;
		n = entry->nlabel;
	}
	if (n < length - 1) {
		int i;

		if (pad_left) {
			for (i = 0; i < length - 1 - n; ++i) {
				label[i] = spc[0];
			}
			(void) memcpy(label + length - 1 - n, src,
				n * sizeof(*label));
		} else {
			(void) memcpy(label, src, n * sizeof(*label));
			for (i = n; i < length - 1; ++i) {
				label[i] = spc[0];
			}
		}
	} else {
		(void) memcpy(label, src, (length - 1) * sizeof(*label));
	}
	label[length - 1] = spc[1];
}